

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase197::run(TestCase197 *this)

{
  TaskSet **this_00;
  anon_enum_32 local_220;
  bool local_219;
  int local_218;
  bool _kj_shouldLog_1;
  undefined1 local_210 [7];
  bool _kj_shouldLog;
  undefined1 local_200 [8];
  siginfo_t info;
  Function<void_()> local_178;
  undefined1 local_168 [8];
  Thread thread;
  pthread_t mainThread;
  WaitScope waitScope;
  undefined1 local_128 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase197 *this_local;
  
  captureSignals();
  this_00 = &loop.daemons.ptr;
  UnixEventPort::UnixEventPort((UnixEventPort *)this_00);
  EventLoop::EventLoop((EventLoop *)local_128,(EventPort *)this_00);
  WaitScope::WaitScope((WaitScope *)&mainThread,(EventLoop *)local_128);
  thread._16_8_ = pthread_self();
  info._sifields._104_8_ = &thread.detached;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase197::run()::__0>
            ((Function<void()> *)&local_178,(Type *)((long)&info._sifields + 0x68));
  Thread::Thread((Thread *)local_168,&local_178);
  Function<void_()>::~Function(&local_178);
  UnixEventPort::onSignal((UnixEventPort *)local_210,(int)&loop + 0x30);
  Promise<siginfo_t>::wait((Promise<siginfo_t> *)local_200,local_210);
  Promise<siginfo_t>::~Promise((Promise<siginfo_t> *)local_210);
  if (local_200._0_4_ != 0x17) {
    _kj_shouldLog_1 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_218 = 0x17;
      _::Debug::log<char_const(&)[41],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0xd3,ERROR,"\"failed: expected \" \"(23) == (info.si_signo)\", 23, info.si_signo",
                 (char (*) [41])"failed: expected (23) == (info.si_signo)",&local_218,
                 (int *)local_200);
      _kj_shouldLog_1 = false;
    }
  }
  if (info.si_signo != -6) {
    local_219 = _::Debug::shouldLog(ERROR);
    while (local_219 != false) {
      local_220 = SI_TKILL;
      _::Debug::log<char_const(&)[46],__0,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"(SI_TKILL) == (info.si_code)\", SI_TKILL, info.si_code",
                 (char (*) [46])"failed: expected (SI_TKILL) == (info.si_code)",&local_220,
                 &info.si_signo);
      local_219 = false;
    }
  }
  Thread::~Thread((Thread *)local_168);
  WaitScope::~WaitScope((WaitScope *)&mainThread);
  EventLoop::~EventLoop((EventLoop *)local_128);
  UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.daemons.ptr);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsAsync) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  // Arrange for a signal to be sent from another thread.
  pthread_t mainThread = pthread_self();
  Thread thread([&]() {
    delay();
    pthread_kill(mainThread, SIGURG);
  });

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
#if __linux__
  EXPECT_SI_CODE(SI_TKILL, info.si_code);
#endif
}